

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool do_vfp_3op_sp(DisasContext_conflict1 *s,undefined1 *fn,int vd,int vn,int vm,_Bool reads_vd)

{
  TCGContext_conflict1 *s_00;
  uint uVar1;
  _Bool _Var2;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGTemp *a1_01;
  TCGTemp *pTVar3;
  TCGv_i64 ret;
  uint uVar4;
  TCGArg a3;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  uVar4 = s->isar->mvfr0;
  if ((uVar4 & 0xf0) == 0) {
    return false;
  }
  uVar6 = (ulong)(uint)vd;
  s_00 = s->uc->tcg_ctx;
  iVar7 = s->vec_len;
  if ((uVar4 & 0xf000000) == 0) {
    if (iVar7 != 0) {
      return false;
    }
    if (s->vec_stride != 0) {
      return false;
    }
    _Var2 = full_vfp_access_check(s,false);
    uVar4 = 0;
    iVar7 = 0;
    uVar1 = 0;
    if (!_Var2) {
      return true;
    }
  }
  else {
    _Var2 = full_vfp_access_check(s,false);
    if (!_Var2) {
      return true;
    }
    if (iVar7 < 1) {
      uVar4 = 0;
      uVar1 = 0;
    }
    else if ((vd & 0x18U) == 0) {
      uVar4 = 0;
      iVar7 = 0;
      uVar1 = 0;
    }
    else {
      uVar4 = s->vec_stride + 1;
      uVar1 = vm & 0x18U;
      if ((vm & 0x18U) != 0) {
        uVar1 = uVar4;
      }
    }
  }
  a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  a1_00 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  a1_01 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar3 - (long)s_00);
  tcg_gen_addi_i64_aarch64(s_00,ret,(TCGv_i64)s_00->cpu_env,0x2ec8);
  tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)a1,(TCGArg)(s_00->cpu_env + (long)s_00),
                      ((ulong)(vn * 4 & 4) | (ulong)(vn * 4 & 8) | (ulong)((uint)vn >> 2) << 8) +
                      0xc10);
  tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)a1_00,(TCGArg)(s_00->cpu_env + (long)s_00),
                      ((ulong)(vm * 4 & 4) | (ulong)(vm * 4 & 8) | (ulong)((uint)vm >> 2) << 8) +
                      0xc10);
  do {
    iVar7 = -iVar7;
    do {
      uVar5 = (uint)uVar6;
      if (reads_vd) {
        a3 = (ulong)(uVar5 * 4 & 4) + ((ulong)(uVar5 * 4 & 8) | (uVar6 >> 2) << 8) + 0xc10;
        tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)a1_01,(TCGArg)(s_00->cpu_env + (long)s_00),
                            a3);
      }
      else {
        a3 = (ulong)(uVar5 * 4 & 4) + ((ulong)(uVar5 * 4 & 8) | (uVar6 >> 2) << 8) + 0xc10;
      }
      (*(code *)fn)(s_00,(long)a1_01 - (long)s_00,(long)a1 - (long)s_00,(long)a1_00 - (long)s_00,ret
                   );
      tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)a1_01,(TCGArg)(s_00->cpu_env + (long)s_00),a3
                         );
      iVar7 = iVar7 + 1;
      if (iVar7 == 1) {
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(((long)a1 - (long)s_00) + (long)s_00));
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(((long)a1_00 - (long)s_00) + (long)s_00));
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(((long)a1_01 - (long)s_00) + (long)s_00));
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
        return true;
      }
      uVar6 = (ulong)(uVar5 & 0xfffffff8 | uVar5 + uVar4 & 7);
      vn = vn & 0xfffffff8U | vn + uVar4 & 7;
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)a1,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)(vn * 4 & 4) + ((ulong)(vn * 4 & 8) | (ulong)((uint)vn >> 2) << 8)
                          + 0xc10);
    } while (uVar1 == 0);
    vm = vm & 0xfffffff8U | uVar1 + vm & 7;
    tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)a1_00,(TCGArg)(s_00->cpu_env + (long)s_00),
                        (ulong)(vm * 4 & 4) + ((ulong)(vm * 4 & 8) | (ulong)((uint)vm >> 2) << 8) +
                        0xc10);
    iVar7 = -iVar7;
  } while( true );
}

Assistant:

static bool do_vfp_3op_sp(DisasContext *s, VFPGen3OpSPFn *fn,
                          int vd, int vn, int vm, bool reads_vd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_m = 0;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i32 f0, f1, fd;
    TCGv_ptr fpst;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_sreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = s->vec_stride + 1;

            if (vfp_sreg_is_scalar(vm)) {
                /* mixed scalar/vector */
                delta_m = 0;
            } else {
                /* vector */
                delta_m = delta_d;
            }
        }
    }

    f0 = tcg_temp_new_i32(tcg_ctx);
    f1 = tcg_temp_new_i32(tcg_ctx);
    fd = tcg_temp_new_i32(tcg_ctx);
    fpst = get_fpstatus_ptr(tcg_ctx, 0);

    neon_load_reg32(tcg_ctx, f0, vn);
    neon_load_reg32(tcg_ctx, f1, vm);

    for (;;) {
        if (reads_vd) {
            neon_load_reg32(tcg_ctx, fd, vd);
        }
        fn(tcg_ctx, fd, f0, f1, fpst);
        neon_store_reg32(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_sreg(vd, delta_d);
        vn = vfp_advance_sreg(vn, delta_d);
        neon_load_reg32(tcg_ctx, f0, vn);
        if (delta_m) {
            vm = vfp_advance_sreg(vm, delta_m);
            neon_load_reg32(tcg_ctx, f1, vm);
        }
    }

    tcg_temp_free_i32(tcg_ctx, f0);
    tcg_temp_free_i32(tcg_ctx, f1);
    tcg_temp_free_i32(tcg_ctx, fd);
    tcg_temp_free_ptr(tcg_ctx, fpst);

    return true;
}